

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_value(sqlite3_stmt *pStmt,int i,sqlite3_value *pValue)

{
  int iVar1;
  sqlite3_value *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  double rValue;
  int rc;
  int in_stack_ffffffffffffffbc;
  sqlite3_stmt *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int i_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar2 = 0xaaaaaaaa;
  iVar1 = sqlite3_value_type(in_RDX);
  i_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  switch((ulong)(iVar1 - 1)) {
  case 0:
    iVar1 = sqlite3_bind_int64((sqlite3_stmt *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),i_00,
                               (sqlite_int64)in_stack_ffffffffffffffc0);
    break;
  case 1:
    if ((in_RDX->flags & 8) == 0) {
      rValue = (double)(in_RDX->u).i;
    }
    else {
      rValue = (in_RDX->u).r;
    }
    iVar1 = sqlite3_bind_double((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                                (int)((ulong)in_RDI >> 0x20),rValue);
    break;
  case 2:
    iVar1 = bindText((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDX >> 0x20),(void *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                     (ulong)(iVar1 - 1),
                     (_func_void_void_ptr *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (u8)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
    break;
  case 3:
    if ((in_RDX->flags & 0x400) == 0) {
      iVar1 = sqlite3_bind_blob((sqlite3_stmt *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),i_00,
                                in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                (_func_void_void_ptr *)0x141534);
    }
    else {
      iVar1 = sqlite3_bind_zeroblob
                        ((sqlite3_stmt *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),i_00,
                         (int)in_stack_ffffffffffffffc8);
    }
    break;
  default:
    iVar1 = sqlite3_bind_null(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_value(sqlite3_stmt *pStmt, int i, const sqlite3_value *pValue){
  int rc;
  switch( sqlite3_value_type((sqlite3_value*)pValue) ){
    case SQLITE_INTEGER: {
      rc = sqlite3_bind_int64(pStmt, i, pValue->u.i);
      break;
    }
    case SQLITE_FLOAT: {
      assert( pValue->flags & (MEM_Real|MEM_IntReal) );
      rc = sqlite3_bind_double(pStmt, i,
          (pValue->flags & MEM_Real) ? pValue->u.r : (double)pValue->u.i
      );
      break;
    }
    case SQLITE_BLOB: {
      if( pValue->flags & MEM_Zero ){
        rc = sqlite3_bind_zeroblob(pStmt, i, pValue->u.nZero);
      }else{
        rc = sqlite3_bind_blob(pStmt, i, pValue->z, pValue->n,SQLITE_TRANSIENT);
      }
      break;
    }
    case SQLITE_TEXT: {
      rc = bindText(pStmt,i,  pValue->z, pValue->n, SQLITE_TRANSIENT,
                              pValue->enc);
      break;
    }
    default: {
      rc = sqlite3_bind_null(pStmt, i);
      break;
    }
  }
  return rc;
}